

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_resampler_internal.h
# Opt level: O2

void __thiscall
cubeb_resampler_speex_one_way<short>::speex_resample
          (cubeb_resampler_speex_one_way<short> *this,short *input_buffer,
          uint32_t *input_frame_count,short *output_buffer,uint32_t *output_frame_count)

{
  speex_resampler_process_interleaved_int
            (this->speex_resampler,input_buffer,input_frame_count,output_buffer,output_frame_count);
  return;
}

Assistant:

void speex_resample(short * input_buffer, uint32_t * input_frame_count,
                      short * output_buffer, uint32_t * output_frame_count)
  {
#ifndef NDEBUG
    int rv;
    rv =
#endif
      speex_resampler_process_interleaved_int(speex_resampler,
                                              input_buffer,
                                              input_frame_count,
                                              output_buffer,
                                              output_frame_count);
    assert(rv == RESAMPLER_ERR_SUCCESS);
  }